

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O0

Slice __thiscall leveldb::InternalKey::user_key(InternalKey *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Slice SVar2;
  string *in_stack_ffffffffffffffc0;
  Slice *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Slice::Slice(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  SVar2 = ExtractUserKey(in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice user_key() const { return ExtractUserKey(rep_); }